

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cxx
# Opt level: O0

void __thiscall array_digest_test::test_method(array_digest_test *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  array<char,_4UL> *in_RDX;
  basic_cstring<const_char> local_b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a0;
  basic_cstring<const_char> local_78 [2];
  basic_cstring<const_char> local_58;
  cryptox local_48 [8];
  string str;
  undefined1 local_28 [8];
  digest_type hash;
  type array;
  array_digest_test *this_local;
  
  hash._M_elems[0xc] = '\0';
  hash._M_elems[0xd] = '\x10';
  hash._M_elems[0xe] = ' ';
  hash._M_elems[0xf] = '0';
  unique0x100001ac = this;
  cryptox::digest<cryptox::message_digest_algorithm<&EVP_sha1,160ul>,std::array<char,4ul>>
            ((type *)local_28,(cryptox *)(hash._M_elems + 0xc),in_RDX);
  cryptox::to_hex<std::array<unsigned_char,20ul>>(local_48,(array<unsigned_char,_20UL> *)local_28);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_78);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_58,0x2b,local_78);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a0,prev,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
               ,0x75);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[41]>
              (&local_a0,&local_b0,0x2b,1,2,local_48,"str",
               "e89fc658068627378403ebfdcefcb13250579b50",
               "\"e89fc658068627378403ebfdcefcb13250579b50\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(array_digest_test) {
	const cryptox::array<char, 4>::type array = { 0x00, 0x10, 0x20, 0x30 };
	const sha1::digest_type hash = digest<sha1>(array);
	const std::string str = to_hex(hash);
	BOOST_CHECK_EQUAL(str, "e89fc658068627378403ebfdcefcb13250579b50");
}